

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_absolute_instructions.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_887c0::CpuAbsoluteTest_eor_abs_set_zero_clears_neg_Test::
~CpuAbsoluteTest_eor_abs_set_zero_clears_neg_Test
          (CpuAbsoluteTest_eor_abs_set_zero_clears_neg_Test *this)

{
  CpuAbsoluteTest_eor_abs_set_zero_clears_neg_Test *this_local;
  
  ~CpuAbsoluteTest_eor_abs_set_zero_clears_neg_Test(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(CpuAbsoluteTest, eor_abs_set_zero_clears_neg) {
    registers.a = 0b10101010;
    registers.p = N_FLAG;
    expected.a = 0b00000000;
    expected.p = Z_FLAG;
    memory_content = 0b10101010;

    run_read_instruction(EOR_ABS);
}